

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O3

Boxed_Value __thiscall chaiscript::ChaiScript_Basic::eval(ChaiScript_Basic *this,AST_Node *t_ast)

{
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  
  detail::Dispatch_Engine::get_stack_holder((Dispatch_Engine *)&t_ast[3].location.filename);
  Type_Conversions::conversion_saves((Type_Conversions *)((long)&t_ast[4].text.field_2 + 8));
  (**(code **)(*in_RDX + 8))(this);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const Boxed_Value eval(const AST_Node &t_ast) {
      try {
        return t_ast.eval(chaiscript::detail::Dispatch_State(m_engine));
      } catch (const exception::eval_error &t_ee) {
        throw Boxed_Value(t_ee);
      }
    }